

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O0

int isDialogVersionBetter09b(void)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  char *__nptr;
  bool local_d9;
  bool local_c9;
  char local_c8 [8];
  char lBuff [128];
  char *lLetter;
  char *lMinorP;
  int lResult;
  int lDate;
  int lMinor;
  int lMajor;
  char *lVersion;
  char *lDialogName;
  
  pcVar3 = dialogNameOnly();
  sVar4 = strlen(pcVar3);
  if ((sVar4 != 0) && (pcVar3 = getVersion(pcVar3), pcVar3 != (char *)0x0)) {
    strcpy(local_c8,pcVar3);
    pcVar5 = strtok(pcVar3," ,.-");
    iVar1 = atoi(pcVar5);
    pcVar5 = strtok((char *)0x0," ,.-abcdefghijklmnopqrstuvxyz");
    iVar2 = atoi(pcVar5);
    __nptr = strtok((char *)0x0," ,.-");
    lMinorP._4_4_ = atoi(__nptr);
    if (lMinorP._4_4_ < 0) {
      lMinorP._4_4_ = -lMinorP._4_4_;
    }
    sVar4 = strlen(pcVar5);
    strcpy(pcVar3,local_c8);
    strtok(pcVar5 + sVar4," ,.-");
    local_c9 = true;
    if (iVar1 < 1) {
      local_d9 = false;
      if ((iVar2 == 9) && (local_d9 = false, pcVar5[sVar4] == 'b')) {
        local_d9 = 0x131a695 < lMinorP._4_4_;
      }
      local_c9 = local_d9;
    }
    return (uint)local_c9;
  }
  return 0;
}

Assistant:

int isDialogVersionBetter09b( )
{
        char const * lDialogName ;
        char * lVersion ;
        int lMajor ;
        int lMinor ;
        int lDate ;
        int lResult ;
        char * lMinorP ;
        char * lLetter ;
        char lBuff[128] ;

        /*char lTest[128] = " 0.9b-20031126" ;*/

        lDialogName = dialogNameOnly() ;
        if ( ! strlen(lDialogName) || !(lVersion = (char *) getVersion(lDialogName)) ) return 0 ;
        /*lVersion = lTest ;*/
        /*printf("lVersion %s\n", lVersion);*/
        strcpy(lBuff,lVersion);
        lMajor = atoi( strtok(lVersion," ,.-") ) ;
        /*printf("lMajor %d\n", lMajor);*/
        lMinorP = strtok(0," ,.-abcdefghijklmnopqrstuvxyz");
        lMinor = atoi( lMinorP ) ;
        /*printf("lMinor %d\n", lMinor );*/
        lDate = atoi( strtok(0," ,.-") ) ;
        if (lDate<0) lDate = - lDate;
        /*printf("lDate %d\n", lDate);*/
        lLetter = lMinorP + strlen(lMinorP) ;
        strcpy(lVersion,lBuff);
        strtok(lLetter," ,.-");
        /*printf("lLetter %s\n", lLetter);*/
        lResult = (lMajor > 0) || ( ( lMinor == 9 ) && (*lLetter == 'b') && (lDate >= 20031126) );
        /*printf("lResult %d\n", lResult);*/
        return lResult;
}